

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

FeatureOptions<wasm::SIMDReplaceOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDReplaceOp>::add<wasm::SIMDReplaceOp>
          (FeatureOptions<wasm::SIMDReplaceOp> *this,FeatureSet feature,SIMDReplaceOp option,
          SIMDReplaceOp rest)

{
  iterator __position;
  vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>> *this_00;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar1;
  key_type local_20;
  SIMDReplaceOp local_1c;
  FeatureSet feature_local;
  SIMDReplaceOp option_local;
  
  local_20.features = feature.features;
  local_1c = option;
  this_00 = (vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
            ::operator[](&this->options,&local_20);
  __position._M_current = *(SIMDReplaceOp **)(this_00 + 8);
  if (__position._M_current == *(SIMDReplaceOp **)(this_00 + 0x10)) {
    std::vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>>::
    _M_realloc_insert<wasm::SIMDReplaceOp_const&>(this_00,__position,&local_1c);
  }
  else {
    *__position._M_current = local_1c;
    *(SIMDReplaceOp **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<>(this,(FeatureSet)local_20.features,rest);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }